

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

object_t * __thiscall
acto::core::runtime_t::create_actor
          (runtime_t *this,unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body,
          actor_thread thread_opt)

{
  atomic<unsigned_long> *paVar1;
  object_t *this_00;
  long lVar2;
  worker_t *this_01;
  object_t *result;
  _Head_base<0UL,_acto::actor_*,_false> local_28;
  
  this_00 = (object_t *)operator_new(0x68);
  local_28._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
       super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
       super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
  super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl = (actor *)0x0;
  object_t::object_t(this_00,thread_opt,
                     (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)&local_28);
  if (local_28._M_head_impl != (actor *)0x0) {
    (*(local_28._M_head_impl)->_vptr_actor[1])();
  }
  local_28._M_head_impl = (actor *)0x0;
  result = this_00;
  if ((thread_opt == bind) &&
     (lVar2 = (anonymous)::thread_context(), *(char *)(lVar2 + 0x40) == '\0')) {
    LOCK();
    (result->references).super___atomic_base<unsigned_long>._M_i =
         (result->references).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    lVar2 = (anonymous)::thread_context();
    std::__detail::
    _Insert_base<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)(lVar2 + 8),&result);
    return result;
  }
  std::mutex::lock(&this->mutex_);
  std::__detail::
  _Insert_base<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->actors_,&result);
  event::reset(&this->no_actors_event_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (thread_opt == exclusive) {
    this_01 = create_worker(this);
    result->field_0x60 = result->field_0x60 | 8;
    result->thread = this_01;
    LOCK();
    paVar1 = &(this->workers_).reserved;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    worker_t::assign(this_01,result,(duration)0x1dcd6500);
  }
  return result;
}

Assistant:

object_t* runtime_t::create_actor(std::unique_ptr<actor> body,
                                  const actor_thread thread_opt) {
  object_t* const result = new core::object_t(thread_opt, std::move(body));
  // Bind actor to the current thread if the thread did not created by the
  // library.
  if (thread_opt == actor_thread::bind && !thread_context.is_worker_thread) {
    result->references += 1;
    thread_context.actors.insert(result);
  } else {
    {
      std::lock_guard<std::mutex> g(mutex_);

      actors_.insert(result);

      no_actors_event_.reset();
    }
    // Create dedicated thread for the actor if necessary.
    if (thread_opt == actor_thread::exclusive) {
      worker_t* const worker = create_worker();

      result->scheduled = true;
      result->thread = worker;

      ++workers_.reserved;

      worker->assign(result, std::chrono::milliseconds(500));
    }
  }

  return result;
}